

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_context.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint7 uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint uVar12;
  uint uVar13;
  int extraout_EAX;
  FILE *__s;
  secp256k1_fe_storage *__ptr;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  secp256k1_fe *psVar18;
  int *piVar19;
  ulong uVar20;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *psVar21;
  secp256k1_fe *extraout_RDX_00;
  secp256k1_fe *extraout_RDX_01;
  secp256k1_fe *extraout_RDX_02;
  secp256k1_fe *extraout_RDX_03;
  size_t keylen;
  size_t keylen_00;
  size_t keylen_01;
  size_t keylen_02;
  size_t outlen;
  size_t outlen_00;
  ulong uVar22;
  secp256k1_fe *rzr;
  secp256k1_fe *extraout_RDX_04;
  secp256k1_fe *extraout_RDX_05;
  secp256k1_fe *extraout_RDX_06;
  int iVar23;
  secp256k1_gej *psVar24;
  secp256k1_ge *psVar25;
  secp256k1_fe_storage *psVar26;
  secp256k1_fe_storage *psVar27;
  void *data;
  ulong uVar28;
  uint64_t *puVar29;
  secp256k1_gej *psVar30;
  char *__ptr_00;
  uint flag;
  bool bVar31;
  bool bVar32;
  byte bVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  size_t __size;
  secp256k1_fe x88_1;
  secp256k1_fe x9;
  secp256k1_fe h2;
  secp256k1_fe sStack_365a8;
  uint64_t *puStack_36580;
  secp256k1_fe nums_x;
  secp256k1_fe x2;
  secp256k1_fe x44_1;
  secp256k1_fe x2_1;
  secp256k1_fe sStack_364b0;
  undefined1 auStack_36488 [24];
  undefined1 auStack_36470 [16];
  int iStack_36460;
  secp256k1_fe x22;
  undefined8 uStack_36430;
  secp256k1_fe sStack_36418;
  secp256k1_fe x88;
  secp256k1_fe x44;
  secp256k1_fe sStack_36378;
  secp256k1_fe x3;
  secp256k1_fe sStack_36320;
  ulong uStack_362f8;
  uint64_t uStack_362f0;
  uint64_t uStack_362e8;
  uint64_t uStack_362e0;
  uint64_t uStack_362d8;
  int iStack_362d0;
  uint64_t uStack_362c8;
  uint64_t uStack_362c0;
  uint64_t uStack_362b8;
  uint64_t uStack_362b0;
  secp256k1_fe sStack_362a8;
  secp256k1_fe n;
  uint64_t auStack_36248 [10];
  secp256k1_fe x6;
  uint64_t uStack_361d0;
  secp256k1_scalar sStack_36170;
  secp256k1_fe_storage *psStack_36150;
  ulong uStack_36148;
  ulong uStack_36140;
  ulong uStack_36138;
  ulong uStack_36130;
  secp256k1_gej sStack_36128;
  ulong uStack_360a8;
  uint7 uStack_360a0;
  byte bStack_36099;
  uint7 uStack_36098;
  byte bStack_36091;
  undefined4 uStack_36090;
  undefined2 uStack_3608c;
  undefined1 uStack_3608a;
  byte bStack_36089;
  secp256k1_scalar sStack_36080;
  secp256k1_fe s;
  secp256k1_ge nums_ge;
  uint32_t uStack_35fc0;
  secp256k1_ge prec [1024];
  
  bVar33 = 0;
  __s = fopen("src/ecmult_static_context.h","w");
  if (__s == (FILE *)0x0) {
    fwrite("Could not open src/ecmult_static_context.h for writing!\n",0x38,1,_stderr);
    iVar23 = -1;
  }
  else {
    fwrite("#ifndef _SECP256K1_ECMULT_STATIC_CONTEXT_\n",0x2a,1,__s);
    fwrite("#define _SECP256K1_ECMULT_STATIC_CONTEXT_\n",0x2a,1,__s);
    fwrite("#include \"src/group.h\"\n",0x17,1,__s);
    fwrite("#define SC SECP256K1_GE_STORAGE_CONST\n",0x26,1,__s);
    fprintf(__s,"#if ECMULT_GEN_PREC_N != %d || ECMULT_GEN_PREC_G != %d\n",0x40,0x10);
    fwrite("   #error configuration mismatch, invalid ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G. Try deleting ecmult_static_context.h before the build.\n"
           ,0x87,1,__s);
    fwrite("#endif\n",7,1,__s);
    data = (void *)0x6c;
    fwrite("static const secp256k1_ge_storage secp256k1_ecmult_static_context[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G] = {\n"
           ,0x6c,1,__s);
    __ptr = (secp256k1_fe_storage *)malloc(0x10000);
    if (__ptr == (secp256k1_fe_storage *)0x0) {
      default_error_callback_fn("Out of memory",data);
      return extraout_EAX;
    }
    auStack_36248[0] = 0x2815b16f81798;
    auStack_36248[1] = 0xdb2dce28d959f;
    auStack_36248[2] = 0xe870b07029bfc;
    auStack_36248[3] = 0xbbac55a06295c;
    auStack_36248[4] = 0x79be667ef9dc;
    auStack_36248[5] = 0x7d08ffb10d4b8;
    auStack_36248[6] = 0x48a68554199c4;
    auStack_36248[7] = 0xe1108a8fd17b4;
    auStack_36248[8] = 0xc4655da4fbfc0;
    auStack_36248[9] = 0x483ada7726a3;
    uStack_362c8 = 0;
    uStack_362c0 = 0;
    uStack_362b8 = 0;
    uStack_362b0 = 0;
    psStack_36150 = __ptr;
    secp256k1_fe_set_b32(&nums_x,(uchar *)"The scalar for this x is unknown");
    nums_ge.x.n[0] = nums_x.n[0];
    nums_ge.x.n[1] = nums_x.n[1];
    nums_ge.x.n[2] = nums_x.n[2];
    nums_ge.x.n[3] = nums_x.n[3];
    nums_ge.x.n[4] = nums_x.n[4];
    secp256k1_fe_sqr(&x2,&nums_x);
    secp256k1_fe_mul(&h2,&nums_x,&x2);
    nums_ge._80_8_ = (ulong)(uint)nums_ge._84_4_ << 0x20;
    secp256k1_fe_add(&h2,&secp256k1_fe_const_b);
    secp256k1_fe_sqr(&x2_1,&h2);
    secp256k1_fe_mul(&x2_1,&x2_1,&h2);
    secp256k1_fe_sqr(&x3,&x2_1);
    secp256k1_fe_mul(&x3,&x3,&h2);
    uStack_361d0 = x6.n[4];
    x6.n[4] = x3.n[4];
    x6.n[3] = x3.n[3];
    x6.n[2] = x3.n[2];
    x6.n[1] = x3.n[1];
    x6.n[0] = x3.n[0];
    iVar23 = 3;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x6,&x6);
    }
    secp256k1_fe_mul(&x6,&x6,&x3);
    iVar23 = 3;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x6,&x6);
    }
    secp256k1_fe_mul(&x6,&x6,&x3);
    iVar23 = 2;
    while( true ) {
      bVar31 = iVar23 == 0;
      iVar23 = iVar23 + -1;
      if (bVar31) break;
      secp256k1_fe_sqr(&x6,&x6);
    }
    secp256k1_fe_mul(&x6,&x6,&x2_1);
    x22.n[4] = x6.n[4];
    x22.n[2] = x6.n[2];
    x22.n[3] = x6.n[3];
    x22.n[0] = x6.n[0];
    x22.n[1] = x6.n[1];
    iVar23 = 0xb;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x22,&x22);
    }
    secp256k1_fe_mul(&x22,&x22,&x6);
    x44.n[4] = x22.n[4];
    x44.n[2] = x22.n[2];
    x44.n[3] = x22.n[3];
    x44.n[0] = x22.n[0];
    x44.n[1] = x22.n[1];
    iVar23 = 0x16;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x44,&x44);
    }
    secp256k1_fe_mul(&x44,&x44,&x22);
    x88.n[4] = x44.n[4];
    x88.n[2] = x44.n[2];
    x88.n[3] = x44.n[3];
    x88.n[0] = x44.n[0];
    x88.n[1] = x44.n[1];
    iVar23 = 0x2c;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x88,&x88);
    }
    secp256k1_fe_mul(&x88,&x88,&x44);
    x9.n[4] = x88.n[4];
    x9.n[2] = x88.n[2];
    x9.n[3] = x88.n[3];
    x9.n[0] = x88.n[0];
    x9.n[1] = x88.n[1];
    iVar23 = 0x58;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x9,&x9);
    }
    secp256k1_fe_mul(&x9,&x9,&x88);
    iVar23 = 0x2c;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x9,&x9);
    }
    secp256k1_fe_mul(&x9,&x9,&x44);
    iVar23 = 3;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x9,&x9);
    }
    secp256k1_fe_mul(&x9,&x9,&x3);
    iVar23 = 0x17;
    while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
      secp256k1_fe_sqr(&x9,&x9);
    }
    secp256k1_fe_mul(&x9,&x9,&x22);
    iVar23 = 6;
    while( true ) {
      bVar31 = iVar23 == 0;
      iVar23 = iVar23 + -1;
      if (bVar31) break;
      secp256k1_fe_sqr(&x9,&x9);
    }
    secp256k1_fe_mul(&x9,&x9,&x2_1);
    secp256k1_fe_sqr(&x9,&x9);
    secp256k1_fe_sqr(&nums_ge.y,&x9);
    secp256k1_fe_sqr(&x9,&nums_ge.y);
    iVar23 = secp256k1_fe_normalizes_to_zero(&prec[0].x);
    psVar21 = extraout_RDX;
    if (iVar23 != 0) {
      uVar14 = (nums_ge.y.n[4] >> 0x30) * 0x1000003d1 + nums_ge.y.n[0];
      uVar15 = (uVar14 >> 0x34) + nums_ge.y.n[1];
      nums_ge.y.n[0] = uVar14 & 0xfffffffffffff;
      uVar14 = (uVar15 >> 0x34) + nums_ge.y.n[2];
      uVar28 = (uVar14 >> 0x34) + nums_ge.y.n[3];
      psVar21 = (secp256k1_fe *)(uVar14 & 0xfffffffffffff);
      nums_ge.y.n[1] = uVar15 & 0xfffffffffffff;
      nums_ge.y.n[4] = (uVar28 >> 0x34) + (nums_ge.y.n[4] & 0xffffffffffff);
      nums_ge.y.n[3] = uVar28 & 0xfffffffffffff;
      if (0xffffefffffc2e < nums_ge.y.n[0] &&
          (((ulong)psVar21 & uVar15 & uVar28) == 0xfffffffffffff && nums_ge.y.n[4] == 0xffffffffffff
          ) || nums_ge.y.n[4] >> 0x30 != 0) {
        uVar14 = nums_ge.y.n[1] + (nums_ge.y.n[0] + 0x1000003d1 >> 0x34);
        nums_ge.y.n[0] = nums_ge.y.n[0] + 0x1000003d1 & 0xfffffffffffff;
        uVar15 = (long)psVar21->n + (uVar14 >> 0x34);
        nums_ge.y.n[1] = uVar14 & 0xfffffffffffff;
        uVar14 = nums_ge.y.n[3] + (uVar15 >> 0x34);
        psVar21 = (secp256k1_fe *)(uVar15 & 0xfffffffffffff);
        nums_ge.y.n[3] = uVar14 & 0xfffffffffffff;
        nums_ge.y.n[4] = (uVar14 >> 0x34) + nums_ge.y.n[4] & 0xffffffffffff;
      }
      nums_ge.y.n[2] = (uint64_t)psVar21;
      if ((nums_ge.y.n[0] & 1) != 0) {
        nums_ge.y.n[0] = 0x3ffffbfffff0bc - nums_ge.y.n[0];
        nums_ge.y.n[1] = 0x3ffffffffffffc - nums_ge.y.n[1];
        nums_ge.y.n[2] = 0x3ffffffffffffc - (long)psVar21;
        nums_ge.y.n[3] = 0x3ffffffffffffc - nums_ge.y.n[3];
        nums_ge.y.n[4] = 0x3fffffffffffc - nums_ge.y.n[4];
      }
    }
    x2_1.n[0] = nums_ge.x.n[0];
    x2_1.n[1] = nums_ge.x.n[1];
    x2_1.n[2] = nums_ge.x.n[2];
    x2_1.n[3] = nums_ge.x.n[3];
    x2_1.n[4] = nums_ge.x.n[4];
    sStack_364b0.n[0] = nums_ge.y.n[0];
    sStack_364b0.n[1] = nums_ge.y.n[1];
    sStack_364b0.n[2] = nums_ge.y.n[2];
    sStack_364b0.n[3] = nums_ge.y.n[3];
    sStack_364b0.n[4] = nums_ge.y.n[4];
    auStack_36488._0_8_ = 1;
    auStack_36488._8_16_ = (undefined1  [16])0x0;
    auStack_36470 = (undefined1  [16])0x0;
    iStack_36460 = 0;
    if (nums_ge.infinity == 0) {
      secp256k1_fe_sqr(&prec[0].x,(secp256k1_fe *)auStack_36488);
      x3.n[4] = nums_ge.x.n[4];
      x3.n[2] = nums_ge.x.n[2];
      x3.n[3] = nums_ge.x.n[3];
      x3.n[0] = nums_ge.x.n[0];
      x3.n[1] = nums_ge.x.n[1];
      secp256k1_fe_normalize_weak(&x3);
      secp256k1_fe_mul(&x6,&secp256k1_ge_const_g.x,&prec[0].x);
      x22.n[4] = nums_ge.y.n[4];
      x22.n[2] = nums_ge.y.n[2];
      x22.n[3] = nums_ge.y.n[3];
      x22.n[0] = nums_ge.y.n[0];
      x22.n[1] = nums_ge.y.n[1];
      secp256k1_fe_normalize_weak(&x22);
      secp256k1_fe_mul(&x44,&secp256k1_ge_const_g.y,&prec[0].x);
      secp256k1_fe_mul(&x44,&x44,(secp256k1_fe *)auStack_36488);
      x88.n[0] = (x6.n[0] - x3.n[0]) + 0x3ffffbfffff0bc;
      x88.n[1] = (x6.n[1] - x3.n[1]) + 0x3ffffffffffffc;
      x88.n[2] = (x6.n[2] - x3.n[2]) + 0x3ffffffffffffc;
      x88.n[3] = (x6.n[3] - x3.n[3]) + 0x3ffffffffffffc;
      x88.n[4] = (x6.n[4] - x3.n[4]) + 0x3fffffffffffc;
      x9.n[0] = (x44.n[0] - x22.n[0]) + 0x3ffffbfffff0bc;
      x9.n[1] = (x44.n[1] - x22.n[1]) + 0x3ffffffffffffc;
      x9.n[2] = (x44.n[2] - x22.n[2]) + 0x3ffffffffffffc;
      x9.n[3] = (x44.n[3] - x22.n[3]) + 0x3ffffffffffffc;
      x9.n[4] = (x44.n[4] - x22.n[4]) + 0x3fffffffffffc;
      iVar23 = secp256k1_fe_normalizes_to_zero_var(&x88);
      if (iVar23 == 0) {
        secp256k1_fe_sqr(&x2,&x9);
        secp256k1_fe_sqr(&h2,&x88);
        secp256k1_fe_mul(&x44_1,&x88,&h2);
        secp256k1_fe_mul((secp256k1_fe *)auStack_36488,(secp256k1_fe *)auStack_36488,&x88);
        secp256k1_fe_mul(&x88_1,&x3,&h2);
        lVar35 = x2.n[0] - (x88_1.n[0] * 2 + x44_1.n[0]);
        lVar36 = x2.n[1] - (x88_1.n[1] * 2 + x44_1.n[1]);
        x2_1.n[0] = lVar35 + 0x7ffff7ffffe178;
        x2_1.n[1] = lVar36 + 0x7ffffffffffff8;
        lVar17 = x2.n[2] - (x88_1.n[2] * 2 + x44_1.n[2]);
        lVar34 = x2.n[3] - (x88_1.n[3] * 2 + x44_1.n[3]);
        x2_1.n[2] = lVar17 + 0x7ffffffffffff8;
        x2_1.n[3] = lVar34 + 0x7ffffffffffff8;
        lVar16 = x2.n[4] - (x88_1.n[4] * 2 + x44_1.n[4]);
        x2_1.n[4] = lVar16 + 0x7fffffffffff8;
        sStack_364b0.n[0] = (x88_1.n[0] - lVar35) + 0x3ffffbfffff0bc;
        sStack_364b0.n[1] = (x88_1.n[1] - lVar36) + 0x3ffffffffffffc;
        sStack_364b0.n[2] = (x88_1.n[2] - lVar17) + 0x3ffffffffffffc;
        sStack_364b0.n[3] = (x88_1.n[3] - lVar34) + 0x3ffffffffffffc;
        sStack_364b0.n[4] = (x88_1.n[4] - lVar16) + 0x3fffffffffffc;
        secp256k1_fe_mul(&sStack_364b0,&sStack_364b0,&x9);
        secp256k1_fe_mul(&x44_1,&x44_1,&x22);
        x44_1.n[0] = 0x3ffffbfffff0bc - x44_1.n[0];
        x44_1.n[1] = 0x3ffffffffffffc - x44_1.n[1];
        sStack_364b0.n[0] = sStack_364b0.n[0] + x44_1.n[0];
        sStack_364b0.n[1] = sStack_364b0.n[1] + x44_1.n[1];
        x44_1.n[2] = 0x3ffffffffffffc - x44_1.n[2];
        x44_1.n[3] = 0x3ffffffffffffc - x44_1.n[3];
        sStack_364b0.n[2] = x44_1.n[2] + sStack_364b0.n[2];
        sStack_364b0.n[3] = x44_1.n[3] + sStack_364b0.n[3];
        sStack_364b0.n[4] = (sStack_364b0.n[4] - x44_1.n[4]) + 0x3fffffffffffc;
        psVar21 = extraout_RDX_05;
      }
      else {
        iVar23 = secp256k1_fe_normalizes_to_zero_var(&x9);
        if (iVar23 == 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)&x2_1);
          psVar21 = extraout_RDX_06;
        }
        else {
          secp256k1_gej_double_var((secp256k1_gej *)&x2_1,(secp256k1_gej *)&x2_1,rzr);
          psVar21 = extraout_RDX_04;
        }
      }
    }
    else {
      x2_1.n[2] = 0xe870b07029bfc;
      x2_1.n[3] = 0xbbac55a06295c;
      x2_1.n[0] = 0x2815b16f81798;
      x2_1.n[1] = 0xdb2dce28d959f;
      x2_1.n[4] = 0x79be667ef9dc;
      sStack_364b0.n[0] = 0x7d08ffb10d4b8;
      sStack_364b0.n[1] = 0x48a68554199c4;
      sStack_364b0.n[2] = 0xe1108a8fd17b4;
      sStack_364b0.n[3] = 0xc4655da4fbfc0;
      sStack_364b0.n[4] = 0x483ada7726a3;
      auStack_36488._0_8_ = 1;
      auStack_36470 = (undefined1  [16])0x0;
      auStack_36488._8_16_ = (undefined1  [16])0x0;
    }
    puVar29 = auStack_36248;
    psVar24 = (secp256k1_gej *)&x3;
    for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
      (psVar24->x).n[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar33 * -2 + 1;
      psVar24 = (secp256k1_gej *)((long)psVar24 + (ulong)bVar33 * -0x10 + 8);
    }
    uStack_362f8 = 1;
    uStack_362f0 = uStack_362c8;
    uStack_362e8 = uStack_362c0;
    uStack_362e0 = uStack_362b8;
    uStack_362d8 = uStack_362b0;
    iStack_362d0 = 0;
    psVar18 = &x2_1;
    psVar24 = (secp256k1_gej *)&x6;
    for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
      (psVar24->x).n[0] = psVar18->n[0];
      psVar18 = (secp256k1_fe *)((long)psVar18 + ((ulong)bVar33 * -2 + 1) * 8);
      psVar24 = (secp256k1_gej *)((long)psVar24 + (ulong)bVar33 * -0x10 + 8);
    }
    psVar24 = (secp256k1_gej *)&nums_ge;
    for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 1) {
      psVar30 = (secp256k1_gej *)&x6;
      puVar29 = (uint64_t *)((long)&nums_ge + lVar16 * 0x800);
      for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar29 = (psVar30->x).n[0];
        psVar30 = (secp256k1_gej *)((long)psVar30 + (ulong)bVar33 * -0x10 + 8);
        puVar29 = puVar29 + (ulong)bVar33 * -2 + 1;
      }
      lVar17 = 0xf;
      psVar18 = (secp256k1_fe *)0x0;
      psVar30 = psVar24;
      while (bVar31 = lVar17 != 0, lVar17 = lVar17 + -1, bVar31) {
        secp256k1_gej_add_var(psVar30 + 1,psVar30,(secp256k1_gej *)&x3,psVar18);
        psVar21 = extraout_RDX_00;
        psVar30 = psVar30 + 1;
      }
      iVar23 = 4;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_gej_double_var((secp256k1_gej *)&x3,(secp256k1_gej *)&x3,psVar21);
        psVar21 = extraout_RDX_01;
      }
      secp256k1_gej_double_var((secp256k1_gej *)&x6,(secp256k1_gej *)&x6,psVar21);
      psVar21 = extraout_RDX_02;
      if (lVar16 == 0x3e) {
        secp256k1_gej_neg((secp256k1_gej *)&x6,(secp256k1_gej *)&x6);
        secp256k1_gej_add_var
                  ((secp256k1_gej *)&x6,(secp256k1_gej *)&x6,(secp256k1_gej *)&x2_1,psVar18);
        psVar21 = extraout_RDX_03;
      }
      psVar24 = psVar24 + 0x10;
    }
    lVar16 = -1;
    piVar19 = &nums_ge.infinity;
    psVar25 = prec;
    for (lVar17 = 0; lVar17 != 0x400; lVar17 = lVar17 + 1) {
      if (piVar19[10] == 0) {
        if (lVar16 == -1) {
          (psVar25->x).n[4] = *(uint64_t *)(piVar19 + 8);
          uVar6 = *(uint64_t *)piVar19;
          uVar7 = *(uint64_t *)(piVar19 + 2);
          uVar8 = *(uint64_t *)(piVar19 + 6);
          (psVar25->x).n[2] = *(uint64_t *)(piVar19 + 4);
          (psVar25->x).n[3] = uVar8;
          (psVar25->x).n[0] = uVar6;
          (psVar25->x).n[1] = uVar7;
          lVar16 = lVar17;
        }
        else {
          secp256k1_fe_mul(&psVar25->x,&prec[lVar16].x,(secp256k1_fe *)piVar19);
          lVar16 = lVar17;
        }
      }
      psVar25 = psVar25 + 1;
      piVar19 = piVar19 + 0x20;
    }
    if (lVar16 != -1) {
      psVar25 = prec + lVar16;
      secp256k1_fe_sqr(&x22,&psVar25->x);
      secp256k1_fe_mul(&x22,&x22,&psVar25->x);
      secp256k1_fe_sqr(&x44,&x22);
      secp256k1_fe_mul(&x44,&x44,&psVar25->x);
      x88.n[4] = x44.n[4];
      x88.n[2] = x44.n[2];
      x88.n[3] = x44.n[3];
      x88.n[0] = x44.n[0];
      x88.n[1] = x44.n[1];
      iVar23 = 3;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&x88,&x88);
      }
      secp256k1_fe_mul(&x88,&x88,&x44);
      x9.n[4] = x88.n[4];
      x9.n[2] = x88.n[2];
      x9.n[3] = x88.n[3];
      x9.n[0] = x88.n[0];
      x9.n[1] = x88.n[1];
      iVar23 = 3;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&x9,&x9);
      }
      secp256k1_fe_mul(&x9,&x9,&x44);
      x2.n[4] = x9.n[4];
      x2.n[2] = x9.n[2];
      x2.n[3] = x9.n[3];
      x2.n[0] = x9.n[0];
      x2.n[1] = x9.n[1];
      iVar23 = 2;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&x2,&x2);
      }
      secp256k1_fe_mul(&x2,&x2,&x22);
      h2.n[4] = x2.n[4];
      h2.n[2] = x2.n[2];
      h2.n[3] = x2.n[3];
      h2.n[0] = x2.n[0];
      h2.n[1] = x2.n[1];
      iVar23 = 0xb;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&h2,&h2);
      }
      secp256k1_fe_mul(&h2,&h2,&x2);
      x44_1.n[4] = h2.n[4];
      x44_1.n[2] = h2.n[2];
      x44_1.n[3] = h2.n[3];
      x44_1.n[0] = h2.n[0];
      x44_1.n[1] = h2.n[1];
      iVar23 = 0x16;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&x44_1,&x44_1);
      }
      secp256k1_fe_mul(&x44_1,&x44_1,&h2);
      x88_1.n[4] = x44_1.n[4];
      x88_1.n[2] = x44_1.n[2];
      x88_1.n[3] = x44_1.n[3];
      x88_1.n[0] = x44_1.n[0];
      x88_1.n[1] = x44_1.n[1];
      iVar23 = 0x2c;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&x88_1,&x88_1);
      }
      secp256k1_fe_mul(&x88_1,&x88_1,&x44_1);
      nums_x.n[4] = x88_1.n[4];
      nums_x.n[2] = x88_1.n[2];
      nums_x.n[3] = x88_1.n[3];
      nums_x.n[0] = x88_1.n[0];
      nums_x.n[1] = x88_1.n[1];
      iVar23 = 0x58;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&nums_x,&nums_x);
      }
      secp256k1_fe_mul(&nums_x,&nums_x,&x88_1);
      iVar23 = 0x2c;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&nums_x,&nums_x);
      }
      secp256k1_fe_mul(&nums_x,&nums_x,&x44_1);
      iVar23 = 3;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&nums_x,&nums_x);
      }
      secp256k1_fe_mul(&nums_x,&nums_x,&x44);
      iVar23 = 0x17;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&nums_x,&nums_x);
      }
      secp256k1_fe_mul(&nums_x,&nums_x,&h2);
      iVar23 = 5;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&nums_x,&nums_x);
      }
      secp256k1_fe_mul(&nums_x,&nums_x,&psVar25->x);
      iVar23 = 3;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&nums_x,&nums_x);
      }
      secp256k1_fe_mul(&nums_x,&nums_x,&x22);
      iVar23 = 2;
      while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
        secp256k1_fe_sqr(&nums_x,&nums_x);
      }
      secp256k1_fe_mul(&sStack_365a8,&psVar25->x,&nums_x);
LAB_00101ea8:
      lVar17 = -lVar16;
      psVar25 = prec + lVar16;
      piVar19 = (int *)((long)&nums_ge + lVar16 * 0x80 + -8);
LAB_00101ec2:
      lVar17 = lVar17 + 1;
      if (lVar17 != 1) goto code_r0x00101ecb;
      prec[lVar16].x.n[4] = sStack_365a8.n[4];
      prec[lVar16].x.n[2] = sStack_365a8.n[2];
      prec[lVar16].x.n[3] = sStack_365a8.n[3];
      prec[lVar16].x.n[0] = sStack_365a8.n[0];
      prec[lVar16].x.n[1] = sStack_365a8.n[1];
      psVar25 = &nums_ge;
      for (lVar16 = 0; lVar16 != 0x16000; lVar16 = lVar16 + 0x58) {
        iVar23 = (int)psVar25[1].x.n[4];
        *(int *)((long)(&prec[0].y + 1) + lVar16) = iVar23;
        if (iVar23 == 0) {
          psVar21 = (secp256k1_fe *)((long)prec[0].x.n + lVar16);
          secp256k1_fe_sqr(&x22,psVar21);
          secp256k1_fe_mul(&x44,&x22,psVar21);
          secp256k1_fe_mul(psVar21,&psVar25->x,&x22);
          secp256k1_fe_mul((secp256k1_fe *)((long)prec[0].y.n + lVar16),&psVar25->y,&x44);
          *(undefined4 *)((long)(&prec[0].y + 1) + lVar16) = 0;
        }
        psVar25 = (secp256k1_ge *)&psVar25[1].y;
      }
    }
    psVar25 = prec;
    psVar26 = psStack_36150;
    for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 1) {
      psVar27 = psVar26;
      for (lVar17 = 0x28; lVar17 != 0x5a8; lVar17 = lVar17 + 0x58) {
        puVar29 = (uint64_t *)((long)(&psVar25->x + -1) + lVar17);
        puVar1 = (uint64_t *)((long)(psVar25->x).n + lVar17 + -0x18);
        nums_ge.x.n[0] = *puVar29;
        nums_ge.x.n[1] = puVar29[1];
        nums_ge.x.n[2] = *puVar1;
        nums_ge.x.n[3] = puVar1[1];
        nums_ge.x.n[4] = *(uint64_t *)((long)(psVar25->x).n + lVar17 + -8);
        secp256k1_fe_normalize(&nums_ge.x);
        x3.n[4] = *(uint64_t *)((long)(psVar25->x).n + lVar17 + 0x20);
        puVar29 = (uint64_t *)((long)(psVar25->x).n + lVar17);
        x3.n[0] = *puVar29;
        x3.n[1] = puVar29[1];
        puVar29 = (uint64_t *)((long)(psVar25->x).n + lVar17 + 0x10);
        x3.n[2] = *puVar29;
        x3.n[3] = puVar29[1];
        secp256k1_fe_normalize(&x3);
        secp256k1_fe_to_storage(psVar27,&nums_ge.x);
        secp256k1_fe_to_storage(psVar27 + 1,&x3);
        psVar27 = psVar27 + 2;
      }
      psVar25 = psVar25 + 0x10;
      psVar26 = psVar26 + 0x20;
    }
    sStack_36128.infinity = 0;
    sStack_36128.x.n[0] = 0x2815b16f81798;
    sStack_36128.x.n[1] = 0xdb2dce28d959f;
    sStack_36128.x.n[2] = 0xe870b07029bfc;
    sStack_36128.x.n[3] = 0xbbac55a06295c;
    sStack_36128.x.n[4] = 0x79be667ef9dc;
    sStack_36128.y.n[0] = 0x7d08ffb10d4b8;
    sStack_36128.y.n[1] = 0x48a68554199c4;
    sStack_36128.y.n[2] = 0xe1108a8fd17b4;
    sStack_36128.y.n[3] = 0xc4655da4fbfc0;
    sStack_36128.y.n[4] = 0x483ada7726a3;
    sStack_36128.z.n[0] = 1;
    sStack_36128.z.n[3] = 0;
    sStack_36128.z.n[4] = 0;
    sStack_36128.z.n[1] = 0;
    sStack_36128.z.n[2] = 0;
    secp256k1_gej_neg(&sStack_36128,&sStack_36128);
    uStack_36148 = 1;
    uStack_36140 = 0;
    uStack_36138 = 0;
    uStack_36130 = 0;
    uStack_360a8 = 0;
    uStack_360a0 = 0;
    bStack_36099 = 0;
    uStack_36098 = 0;
    bStack_36091 = 0;
    uStack_36090 = 0;
    uStack_3608c = 0;
    uStack_3608a = 0;
    bStack_36089 = 1;
    x44.n[4] = 0;
    x44.n[1] = 0;
    x44.n[0] = 0;
    x44.n[2] = 0;
    x44.n[3] = 0x100000000000000;
    puVar29 = x6.n + 4;
    x6.n[1] = 0x101010101010101;
    x6.n[0] = 0x101010101010101;
    x6.n[3] = 0x101010101010101;
    x6.n[2] = 0x101010101010101;
    stack0xfffffffffffc9e28 = ZEXT816(0);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar29,keylen);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,"",1);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x44,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar29);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar29,keylen_00);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)&x6);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar29,keylen_01);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,"\x01",1);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x44,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar29);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar29,keylen_02);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)&x6);
    x44.n[0] = 0;
    x44.n[1] = 0;
    x44.n[2] = 0;
    x44.n[3] = 0;
    x44.n[4] = 0;
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)&x6,(uchar *)&uStack_360a8,outlen);
    uVar12 = secp256k1_fe_set_b32(&s,(uchar *)&uStack_360a8);
    secp256k1_fe_cmov(&s,&secp256k1_fe_one,
                      (uint)(((s.n[3] == 0 && s.n[1] == 0) && (s.n[2] == 0 && s.n[0] == 0)) &&
                            s.n[4] == 0) | uVar12 ^ 1);
    secp256k1_fe_sqr(&nums_ge.x,&s);
    secp256k1_fe_mul(&sStack_36128.x,&sStack_36128.x,&nums_ge.x);
    psVar21 = &sStack_36128.y;
    secp256k1_fe_mul(psVar21,psVar21,&nums_ge.x);
    secp256k1_fe_mul(psVar21,psVar21,&s);
    secp256k1_fe_mul(&sStack_36128.z,&sStack_36128.z,&s);
    secp256k1_fe_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)&x6,(uchar *)&uStack_360a8,outlen_00);
    uVar9 = CONCAT16(uStack_3608a,CONCAT24(uStack_3608c,uStack_36090));
    sStack_36080.d[0] =
         (ulong)bStack_36089 | ((ulong)uVar9 & 0xff000000000000) >> 0x28 |
         ((ulong)uVar9 & 0xff0000000000) >> 0x18 | ((ulong)uVar9 & 0xff00000000) >> 8 |
         ((ulong)uVar9 & 0xff000000) << 8 | ((ulong)uVar9 & 0xff0000) << 0x18 |
         ((ulong)uVar9 & 0xff00) << 0x28 | CONCAT17(bStack_36089,uVar9) << 0x38;
    sStack_36080.d[1] =
         (ulong)bStack_36091 | ((ulong)uStack_36098 & 0xff000000000000) >> 0x28 |
         ((ulong)uStack_36098 & 0xff0000000000) >> 0x18 | ((ulong)uStack_36098 & 0xff00000000) >> 8
         | ((ulong)uStack_36098 & 0xff000000) << 8 | ((ulong)uStack_36098 & 0xff0000) << 0x18 |
         ((ulong)uStack_36098 & 0xff00) << 0x28 | CONCAT17(bStack_36091,uStack_36098) << 0x38;
    sStack_36080.d[2] =
         (ulong)bStack_36099 | ((ulong)uStack_360a0 & 0xff000000000000) >> 0x28 |
         ((ulong)uStack_360a0 & 0xff0000000000) >> 0x18 | ((ulong)uStack_360a0 & 0xff00000000) >> 8
         | ((ulong)uStack_360a0 & 0xff000000) << 8 | ((ulong)uStack_360a0 & 0xff0000) << 0x18 |
         ((ulong)uStack_360a0 & 0xff00) << 0x28 | CONCAT17(bStack_36099,uStack_360a0) << 0x38;
    sStack_36080.d[3] =
         uStack_360a8 >> 0x38 | (uStack_360a8 & 0xff000000000000) >> 0x28 |
         (uStack_360a8 & 0xff0000000000) >> 0x18 | (uStack_360a8 & 0xff00000000) >> 8 |
         (uStack_360a8 & 0xff000000) << 8 | (uStack_360a8 & 0xff0000) << 0x18 |
         (uStack_360a8 & 0xff00) << 0x28 | uStack_360a8 << 0x38;
    uVar12 = secp256k1_scalar_check_overflow(&sStack_36080);
    secp256k1_scalar_reduce(&sStack_36080,uVar12);
    uVar14 = 0;
    bVar4 = sStack_36080.d[1] == 0;
    bVar5 = sStack_36080.d[0] == 0;
    bVar32 = sStack_36080.d[2] == 0;
    bVar31 = sStack_36080.d[3] == 0;
    if (((bVar4 && bVar5) && bVar32) && bVar31) {
      sStack_36080.d[0] = uVar14;
    }
    if (((bVar4 && bVar5) && bVar32) && bVar31) {
      sStack_36080.d[1] = uVar14;
    }
    if (((bVar4 && bVar5) && bVar32) && bVar31) {
      sStack_36080.d[2] = uVar14;
    }
    sStack_36080.d[0] = sStack_36080.d[0] | (((bVar4 && bVar5) && bVar32) && bVar31);
    x6.n[0] = 0;
    x6.n[1] = 0;
    x6.n[2] = 0;
    x6.n[3] = 0;
    stack0xfffffffffffc9e28 = (undefined1  [16])0x0;
    uStack_360a8 = 0;
    uStack_360a0 = 0;
    bStack_36099 = 0;
    uStack_36098 = 0;
    bStack_36091 = 0;
    uStack_36090 = 0;
    uStack_3608c = 0;
    uStack_3608a = 0;
    bStack_36089 = 0;
    x22.n[0] = 0;
    x22.n[1] = 0;
    x22.n[2] = 0;
    x22.n[3] = 0;
    stack0xfffffffffffc9bc8 = (undefined1  [16])0x0;
    psVar24 = &sStack_36128;
    psVar25 = &nums_ge;
    for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
      (psVar25->x).n[0] = (psVar24->x).n[0];
      psVar24 = (secp256k1_gej *)((long)psVar24 + ((ulong)bVar33 * -2 + 1) * 8);
      psVar25 = (secp256k1_ge *)((long)psVar25 + (ulong)bVar33 * -0x10 + 8);
    }
    sStack_36170.d[0] = sStack_36080.d[0] + uStack_36148;
    uVar15 = sStack_36080.d[1] + CARRY8(sStack_36080.d[0],uStack_36148);
    bVar31 = CARRY8(sStack_36080.d[2],uStack_36138);
    bVar32 = CARRY8(sStack_36080.d[3],uStack_36130);
    uVar22 = sStack_36080.d[3] + uStack_36130;
    uVar20 = (ulong)CARRY8(sStack_36080.d[1],(ulong)CARRY8(sStack_36080.d[0],uStack_36148));
    sStack_36170.d[1] = uVar15 + uStack_36140;
    uVar15 = (ulong)CARRY8(uVar15,uStack_36140);
    uVar28 = sStack_36080.d[2] + uStack_36138 + uVar20;
    sStack_36170.d[2] = uVar28 + uVar15;
    uVar15 = (ulong)(CARRY8(sStack_36080.d[2] + uStack_36138,uVar20) || CARRY8(uVar28,uVar15));
    uVar28 = bVar31 + uVar22;
    sStack_36170.d[3] = uVar28 + uVar15;
    iVar23 = secp256k1_scalar_check_overflow(&sStack_36170);
    secp256k1_scalar_reduce
              (&sStack_36170,
               (uint)bVar32 + iVar23 + (uint)(CARRY8((ulong)bVar31,uVar22) || CARRY8(uVar28,uVar15))
              );
    psVar26 = psStack_36150;
    for (; uVar14 != 0x40; uVar14 = uVar14 + 1) {
      uVar15 = sStack_36170.d[uVar14 >> 4 & 0xfffffff];
      psVar27 = psVar26;
      for (uVar28 = 0; uVar28 != 0x10; uVar28 = uVar28 + 1) {
        uVar12 = (uint)(((uint)(uVar15 >> ((char)uVar14 * '\x04' & 0x3fU)) & 0xf) == uVar28);
        secp256k1_fe_storage_cmov((secp256k1_fe_storage *)&x22,psVar27,uVar12);
        secp256k1_fe_storage_cmov((secp256k1_fe_storage *)(x22.n + 4),psVar27 + 1,uVar12);
        psVar27 = psVar27 + 2;
      }
      secp256k1_fe_from_storage(&x3,(secp256k1_fe_storage *)&x22);
      secp256k1_fe_from_storage(&sStack_36320,(secp256k1_fe_storage *)(x22.n + 4));
      uStack_362f8 = uStack_362f8 & 0xffffffff00000000;
      secp256k1_fe_sqr(&x88,(secp256k1_fe *)&nums_ge.infinity);
      x9.n[4] = nums_ge.x.n[4];
      x9.n[2] = nums_ge.x.n[2];
      x9.n[3] = nums_ge.x.n[3];
      x9.n[0] = nums_ge.x.n[0];
      x9.n[1] = nums_ge.x.n[1];
      secp256k1_fe_normalize_weak(&x9);
      secp256k1_fe_mul(&x2,&x3,&x88);
      h2.n[4] = nums_ge.y.n[4];
      h2.n[2] = nums_ge.y.n[2];
      h2.n[3] = nums_ge.y.n[3];
      h2.n[0] = nums_ge.y.n[0];
      h2.n[1] = nums_ge.y.n[1];
      secp256k1_fe_normalize_weak(&h2);
      secp256k1_fe_mul(&x44_1,&sStack_36320,&x88);
      secp256k1_fe_mul(&x44_1,&x44_1,(secp256k1_fe *)&nums_ge.infinity);
      uVar11 = x2.n[4];
      uVar10 = x2.n[3];
      uVar8 = x2.n[2];
      uVar7 = x2.n[1];
      uVar6 = x2.n[0];
      x88_1.n[0] = x9.n[0] + x2.n[0];
      x88_1.n[1] = x9.n[1] + x2.n[1];
      x88_1.n[2] = x9.n[2] + x2.n[2];
      x88_1.n[3] = x9.n[3] + x2.n[3];
      x88_1.n[4] = x9.n[4] + x2.n[4];
      sStack_365a8.n[0] = h2.n[0] + x44_1.n[0];
      sStack_365a8.n[1] = h2.n[1] + x44_1.n[1];
      sStack_365a8.n[2] = h2.n[2] + x44_1.n[2];
      sStack_365a8.n[3] = h2.n[3] + x44_1.n[3];
      sStack_365a8.n[4] = h2.n[4] + x44_1.n[4];
      secp256k1_fe_sqr(&sStack_36378,&x88_1);
      sStack_36418.n[0] = 0x3ffffbfffff0bc - uVar6;
      sStack_36418.n[1] = 0x3ffffffffffffc - uVar7;
      sStack_36418.n[2] = 0x3ffffffffffffc - uVar8;
      sStack_36418.n[3] = 0x3ffffffffffffc - uVar10;
      sStack_36418.n[4] = 0x3fffffffffffc - uVar11;
      secp256k1_fe_mul(&nums_x,&x9,&sStack_36418);
      sStack_36378.n[0] = sStack_36378.n[0] + nums_x.n[0];
      sStack_36378.n[1] = sStack_36378.n[1] + nums_x.n[1];
      sStack_36378.n[2] = sStack_36378.n[2] + nums_x.n[2];
      sStack_36378.n[3] = sStack_36378.n[3] + nums_x.n[3];
      sStack_36378.n[4] = sStack_36378.n[4] + nums_x.n[4];
      uVar12 = secp256k1_fe_normalizes_to_zero(&sStack_365a8);
      uVar13 = secp256k1_fe_normalizes_to_zero(&sStack_36378);
      h2.n[0] = h2.n[0] * 2;
      h2.n[1] = h2.n[1] * 2;
      h2.n[2] = h2.n[2] * 2;
      h2.n[3] = h2.n[3] * 2;
      h2.n[4] = h2.n[4] << 1;
      sStack_36418.n[0] = (0x3ffffbfffff0bc - uVar6) + x9.n[0];
      sStack_36418.n[1] = (0x3ffffffffffffc - uVar7) + x9.n[1];
      sStack_36418.n[2] = (0x3ffffffffffffc - uVar8) + x9.n[2];
      sStack_36418.n[3] = (0x3ffffffffffffc - uVar10) + x9.n[3];
      sStack_36418.n[4] = (0x3fffffffffffc - uVar11) + x9.n[4];
      flag = uVar12 & uVar13 ^ 1;
      secp256k1_fe_cmov(&h2,&sStack_36378,flag);
      secp256k1_fe_cmov(&sStack_36418,&sStack_365a8,flag);
      secp256k1_fe_sqr(&n,&sStack_36418);
      secp256k1_fe_mul(&sStack_362a8,&n,&x88_1);
      secp256k1_fe_sqr(&n,&n);
      secp256k1_fe_cmov(&n,&sStack_365a8,uVar12 & uVar13);
      secp256k1_fe_sqr(&x88_1,&h2);
      piVar19 = &nums_ge.infinity;
      secp256k1_fe_mul((secp256k1_fe *)piVar19,(secp256k1_fe *)piVar19,&sStack_36418);
      iVar23 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)piVar19);
      nums_ge._80_8_ = nums_ge._80_8_ * 2;
      lVar16 = 0x3fffffffffffc - sStack_362a8.n[4];
      x88_1.n[4] = x88_1.n[4] + lVar16;
      lVar17 = 0x3ffffffffffffc - sStack_362a8.n[2];
      lVar35 = 0x3ffffffffffffc - sStack_362a8.n[3];
      x88_1.n[2] = x88_1.n[2] + lVar17;
      x88_1.n[3] = x88_1.n[3] + lVar35;
      lVar34 = 0x3ffffbfffff0bc - sStack_362a8.n[0];
      lVar36 = 0x3ffffffffffffc - sStack_362a8.n[1];
      x88_1.n[0] = x88_1.n[0] + lVar34;
      x88_1.n[1] = x88_1.n[1] + lVar36;
      secp256k1_fe_normalize_weak(&x88_1);
      nums_ge.x.n[4] = x88_1.n[4];
      nums_ge.x.n[2] = x88_1.n[2];
      nums_ge.x.n[3] = x88_1.n[3];
      nums_ge.x.n[0] = x88_1.n[0];
      nums_ge.x.n[1] = x88_1.n[1];
      x88_1.n[0] = x88_1.n[0] * 2 + lVar34;
      x88_1.n[1] = x88_1.n[1] * 2 + lVar36;
      x88_1.n[2] = x88_1.n[2] * 2 + lVar17;
      x88_1.n[3] = x88_1.n[3] * 2 + lVar35;
      x88_1.n[4] = lVar16 + x88_1.n[4] * 2;
      secp256k1_fe_mul(&x88_1,&x88_1,&h2);
      x88_1.n[0] = x88_1.n[0] + n.n[0];
      x88_1.n[1] = x88_1.n[1] + n.n[1];
      nums_ge.y.n[0] = 0x7ffff7ffffe178 - x88_1.n[0];
      nums_ge.y.n[1] = 0x7ffffffffffff8 - x88_1.n[1];
      nums_ge.y.n[2] = 0x7ffffffffffff8 - (n.n[2] + x88_1.n[2]);
      nums_ge.y.n[3] = 0x7ffffffffffff8 - (n.n[3] + x88_1.n[3]);
      nums_ge.y.n[4] = 0x7fffffffffff8 - (n.n[4] + x88_1.n[4]);
      secp256k1_fe_normalize_weak(&nums_ge.y);
      nums_ge.x.n[0] = nums_ge.x.n[0] << 2;
      nums_ge.x.n[1] = nums_ge.x.n[1] << 2;
      nums_ge.x.n[2] = nums_ge.x.n[2] << 2;
      nums_ge.x.n[3] = nums_ge.x.n[3] << 2;
      nums_ge.x.n[4] = nums_ge.x.n[4] << 2;
      nums_ge.y.n[0] = nums_ge.y.n[0] << 2;
      nums_ge.y.n[1] = nums_ge.y.n[1] << 2;
      nums_ge.y.n[2] = nums_ge.y.n[2] << 2;
      nums_ge.y.n[3] = nums_ge.y.n[3] << 2;
      nums_ge.y.n[4] = nums_ge.y.n[4] << 2;
      secp256k1_fe_cmov(&nums_ge.x,&x3,uStack_35fc0);
      secp256k1_fe_cmov(&nums_ge.y,&sStack_36320,uStack_35fc0);
      secp256k1_fe_cmov((secp256k1_fe *)piVar19,(secp256k1_fe *)secp256k1_gej_add_ge_fe_1,
                        uStack_35fc0);
      psVar26 = psVar26 + 0x20;
      uStack_35fc0 = (1 - uStack_35fc0) * iVar23;
    }
    secp256k1_fe_clear(&x3);
    secp256k1_fe_clear(&sStack_36320);
    secp256k1_gej_clear((secp256k1_gej *)&nums_ge);
    puStack_36580 = psStack_36150[1].n + 3;
    for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 1) {
      fwrite("{\n",2,1,__s);
      for (lVar17 = 0; lVar17 != 0x400; lVar17 = lVar17 + 0x40) {
        uVar14 = *(ulong *)((long)puStack_36580 + lVar17 + -0x20);
        uVar15 = *(ulong *)((long)puStack_36580 + lVar17 + -0x28);
        uVar28 = *(ulong *)((long)puStack_36580 + lVar17 + -0x38);
        uVar20 = *(ulong *)((long)puStack_36580 + lVar17 + -0x30);
        uVar22 = *(ulong *)((long)puStack_36580 + lVar17 + -8);
        uVar2 = *(ulong *)((long)puStack_36580 + lVar17 + -0x10);
        uVar3 = *(ulong *)((long)puStack_36580 + lVar17 + -0x18);
        fprintf(__s,
                "    SC(%uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu)"
                ,uVar14 >> 0x20,uVar14,uVar15 >> 0x20,uVar15,uVar20 >> 0x20,uVar20,uVar28 >> 0x20,
                uVar28,*(ulong *)((long)puStack_36580 + lVar17) >> 0x20,
                *(ulong *)((long)puStack_36580 + lVar17),uVar22 >> 0x20,uVar22,uVar2 >> 0x20,uVar2,
                uVar3 >> 0x20,uVar3);
        if (lVar17 == 0x3c0) {
          fputc(10,__s);
        }
        else {
          fwrite(",\n",2,1,__s);
        }
      }
      if (lVar16 == 0x3f) {
        __ptr_00 = "}\n";
        __size = 2;
      }
      else {
        __ptr_00 = "},\n";
        __size = 3;
      }
      fwrite(__ptr_00,__size,1,__s);
      puStack_36580 = puStack_36580 + 0x80;
    }
    fwrite("};\n",3,1,__s);
    secp256k1_gej_clear(&sStack_36128);
    free(__ptr);
    fwrite("#undef SC\n",10,1,__s);
    fwrite("#endif\n",7,1,__s);
    fclose(__s);
    iVar23 = 0;
  }
  return iVar23;
code_r0x00101ecb:
  psVar25 = psVar25 + -1;
  iVar23 = *piVar19;
  piVar19 = piVar19 + -0x20;
  if (iVar23 == 0) goto code_r0x00101ed8;
  goto LAB_00101ec2;
code_r0x00101ed8:
  secp256k1_fe_mul(&prec[lVar16].x,&psVar25->x,&sStack_365a8);
  secp256k1_fe_mul(&sStack_365a8,&sStack_365a8,
                   (secp256k1_fe *)((long)&nums_ge + lVar16 * 0x80 + 0x50));
  lVar16 = -lVar17;
  goto LAB_00101ea8;
}

Assistant:

int main(int argc, char **argv) {
    secp256k1_ecmult_gen_context ctx;
    void *prealloc, *base;
    int inner;
    int outer;
    FILE* fp;

    (void)argc;
    (void)argv;

    fp = fopen("src/ecmult_static_context.h","w");
    if (fp == NULL) {
        fprintf(stderr, "Could not open src/ecmult_static_context.h for writing!\n");
        return -1;
    }

    fprintf(fp, "#ifndef _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(fp, "#define _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(fp, "#include \"src/group.h\"\n");
    fprintf(fp, "#define SC SECP256K1_GE_STORAGE_CONST\n");
    fprintf(fp, "#if ECMULT_GEN_PREC_N != %d || ECMULT_GEN_PREC_G != %d\n", ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G);
    fprintf(fp, "   #error configuration mismatch, invalid ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G. Try deleting ecmult_static_context.h before the build.\n");
    fprintf(fp, "#endif\n");
    fprintf(fp, "static const secp256k1_ge_storage secp256k1_ecmult_static_context[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G] = {\n");

    base = checked_malloc(&default_error_callback, SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE);
    prealloc = base;
    secp256k1_ecmult_gen_context_init(&ctx);
    secp256k1_ecmult_gen_context_build(&ctx, &prealloc);
    for(outer = 0; outer != ECMULT_GEN_PREC_N; outer++) {
        fprintf(fp,"{\n");
        for(inner = 0; inner != ECMULT_GEN_PREC_G; inner++) {
            fprintf(fp,"    SC(%uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu)", SECP256K1_GE_STORAGE_CONST_GET((*ctx.prec)[outer][inner]));
            if (inner != ECMULT_GEN_PREC_G - 1) {
                fprintf(fp,",\n");
            } else {
                fprintf(fp,"\n");
            }
        }
        if (outer != ECMULT_GEN_PREC_N - 1) {
            fprintf(fp,"},\n");
        } else {
            fprintf(fp,"}\n");
        }
    }
    fprintf(fp,"};\n");
    secp256k1_ecmult_gen_context_clear(&ctx);
    free(base);

    fprintf(fp, "#undef SC\n");
    fprintf(fp, "#endif\n");
    fclose(fp);

    return 0;
}